

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O1

RealType __thiscall OpenMD::Thermo::getRotationalKinetic(Thermo *this)

{
  int iVar1;
  undefined1 auVar2 [16];
  Molecule *pMVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  StuntDouble *pSVar7;
  Snapshot *this_00;
  double *pdVar8;
  double *pdVar9;
  pointer ppSVar10;
  byte bVar11;
  double dVar12;
  RealType RVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Vector3d angMom;
  MoleculeIterator miter;
  Mat3x3d I;
  double local_f8 [4];
  Snapshot *local_d8;
  MoleculeIterator local_d0;
  double local_c8 [10];
  double local_78 [9];
  
  bVar11 = 0;
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasRotationalKineticEnergy == false) {
    local_d0._M_node = (_Base_ptr)0x0;
    local_f8[2] = 0.0;
    local_f8[0] = 0.0;
    local_f8[1] = 0.0;
    local_c8[8] = 0.0;
    local_c8[6] = 0.0;
    local_c8[7] = 0.0;
    local_c8[4] = 0.0;
    local_c8[5] = 0.0;
    local_c8[2] = 0.0;
    local_c8[3] = 0.0;
    local_c8[0] = 0.0;
    local_c8[1] = 0.0;
    pMVar3 = SimInfo::beginMolecule(this->info_,&local_d0);
    if (pMVar3 == (Molecule *)0x0) {
      dVar12 = 0.0;
    }
    else {
      dVar12 = 0.0;
      local_d8 = this_00;
      do {
        ppSVar10 = (pMVar3->integrableObjects_).
                   super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if (ppSVar10 ==
            (pMVar3->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pSVar7 = (StuntDouble *)0x0;
        }
        else {
          pSVar7 = *ppSVar10;
        }
        while (pSVar7 != (StuntDouble *)0x0) {
          ppSVar10 = ppSVar10 + 1;
          if (pSVar7->objType_ - otDAtom < 2) {
            lVar5 = *(long *)((long)&(pSVar7->snapshotMan_->currentSnapshot_->atomData).
                                     angularMomentum.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + pSVar7->storage_);
            local_f8[2] = *(double *)(lVar5 + 0x10 + (long)pSVar7->localIndex_ * 0x18);
            pdVar8 = (double *)(lVar5 + (long)pSVar7->localIndex_ * 0x18);
            local_f8[0] = *pdVar8;
            local_f8[1] = pdVar8[1];
            (*pSVar7->_vptr_StuntDouble[5])(local_78,pSVar7);
            pdVar8 = local_78;
            pdVar9 = local_c8;
            for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
              *pdVar9 = *pdVar8;
              pdVar8 = pdVar8 + (ulong)bVar11 * -2 + 1;
              pdVar9 = pdVar9 + (ulong)bVar11 * -2 + 1;
            }
            if (pSVar7->linear_ == true) {
              iVar1 = pSVar7->linearAxis_;
              uVar6 = (ulong)(((iVar1 + 1) / 3) * -3 + iVar1 + 1);
              uVar4 = (ulong)(iVar1 + ((iVar1 + 2) / 3) * -3 + 2);
              auVar14._0_8_ = local_f8[uVar6] * local_f8[uVar6];
              auVar14._8_8_ = local_f8[uVar4] * local_f8[uVar4];
              auVar2._8_8_ = local_c8[uVar4 * 4];
              auVar2._0_8_ = local_c8[uVar6 * 4];
              auVar15 = divpd(auVar14,auVar2);
              dVar12 = dVar12 + auVar15._8_8_ + auVar15._0_8_;
            }
            else {
              auVar16._0_8_ = local_f8[0] * local_f8[0];
              auVar16._8_8_ = local_f8[2] * local_f8[2];
              auVar15._8_8_ = local_c8[8];
              auVar15._0_8_ = local_c8[0];
              auVar15 = divpd(auVar16,auVar15);
              dVar12 = dVar12 + auVar15._8_8_ +
                                (local_f8[1] * local_f8[1]) / local_c8[4] + auVar15._0_8_;
            }
          }
          if (ppSVar10 ==
              (pMVar3->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pSVar7 = (StuntDouble *)0x0;
          }
          else {
            pSVar7 = *ppSVar10;
          }
        }
        pMVar3 = SimInfo::nextMolecule(this->info_,&local_d0);
      } while (pMVar3 != (Molecule *)0x0);
      dVar12 = dVar12 * 0.5;
      this_00 = local_d8;
    }
    Snapshot::setRotationalKineticEnergy(this_00,dVar12 / 0.0004184);
  }
  RVar13 = Snapshot::getRotationalKineticEnergy(this_00);
  return RVar13;
}

Assistant:

RealType Thermo::getRotationalKinetic() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasRotationalKineticEnergy) {
      SimInfo::MoleculeIterator miter;
      vector<StuntDouble*>::iterator iiter;
      Molecule* mol;
      StuntDouble* sd;
      Vector3d angMom;
      Mat3x3d I;
      int i, j, k;
      RealType kinetic(0.0);

      for (mol = info_->beginMolecule(miter); mol != NULL;
           mol = info_->nextMolecule(miter)) {
        for (sd = mol->beginIntegrableObject(iiter); sd != NULL;
             sd = mol->nextIntegrableObject(iiter)) {
          if (sd->isDirectional()) {
            angMom = sd->getJ();
            I      = sd->getI();

            if (sd->isLinear()) {
              i = sd->linearAxis();
              j = (i + 1) % 3;
              k = (i + 2) % 3;
              kinetic += angMom[j] * angMom[j] / I(j, j) +
                         angMom[k] * angMom[k] / I(k, k);
            } else {
              kinetic += angMom[0] * angMom[0] / I(0, 0) +
                         angMom[1] * angMom[1] / I(1, 1) +
                         angMom[2] * angMom[2] / I(2, 2);
            }
          }
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &kinetic, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
#endif

      kinetic = kinetic * 0.5 / Constants::energyConvert;

      snap->setRotationalKineticEnergy(kinetic);
    }
    return snap->getRotationalKineticEnergy();
  }